

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_predictive_coefficients_stability_check.h
# Opt level: O1

void __thiscall sptk::LinearPredictiveCoefficientsStabilityCheck::Buffer::~Buffer(Buffer *this)

{
  pointer pdVar1;
  
  this->_vptr_Buffer = (_func_int **)&PTR__Buffer_00110bd8;
  pdVar1 = (this->parcor_coefficients_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  (this->reconversion_buffer_)._vptr_Buffer = (_func_int **)&PTR__Buffer_00110c38;
  pdVar1 = (this->reconversion_buffer_).a_.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  (this->conversion_buffer_)._vptr_Buffer = (_func_int **)&PTR__Buffer_00110c08;
  pdVar1 = (this->conversion_buffer_).a_.super__Vector_base<double,_std::allocator<double>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Buffer() {
    }